

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa_asn1.cc
# Opt level: O2

int i2d_DSAPrivateKey(DSA *a,uchar **pp)

{
  int iVar1;
  CBB cbb;
  
  iVar1 = CBB_init(&cbb,0);
  if ((iVar1 != 0) && (iVar1 = DSA_marshal_private_key(&cbb,(DSA *)a), iVar1 != 0)) {
    iVar1 = CBB_finish_i2d(&cbb,pp);
    return iVar1;
  }
  CBB_cleanup(&cbb);
  return -1;
}

Assistant:

int i2d_DSAPrivateKey(const DSA *in, uint8_t **outp) {
  CBB cbb;
  if (!CBB_init(&cbb, 0) ||
      !DSA_marshal_private_key(&cbb, in)) {
    CBB_cleanup(&cbb);
    return -1;
  }
  return CBB_finish_i2d(&cbb, outp);
}